

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreenode(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  char *z;
  int local_45c;
  undefined1 auStack_458 [4];
  int jj;
  RtreeCell cell;
  sqlite3_str *pOut;
  int errCode;
  int nData;
  int ii;
  Rtree tree;
  RtreeNode node;
  sqlite3_value **apArg_local;
  int nArg_local;
  sqlite3_context *ctx_local;
  
  memset(tree.aHash + 0x60,0,0x28);
  memset(&nData,0,0x3c8);
  iVar1 = sqlite3_value_int(*apArg);
  tree.db._4_1_ = (byte)iVar1;
  if ((tree.db._4_1_ != 0) && (tree.db._4_1_ < 6)) {
    tree.db._5_1_ = tree.db._4_1_ << 1;
    tree.db._7_1_ = tree.db._4_1_ * '\b' + 8;
    pvVar3 = sqlite3_value_blob(apArg[1]);
    iVar1 = sqlite3_value_bytes(apArg[1]);
    if ((3 < iVar1) &&
       (iVar2 = readInt16((u8 *)((long)pvVar3 + 2)), (int)(iVar2 * (uint)tree.db._7_1_) <= iVar1)) {
      cell.aCoord._32_8_ = sqlite3_str_new((sqlite3 *)0x0);
      for (errCode = 0; iVar1 = readInt16((u8 *)((long)pvVar3 + 2)), errCode < iVar1;
          errCode = errCode + 1) {
        nodeGetCell((Rtree *)&nData,(RtreeNode *)(tree.aHash + 0x60),errCode,
                    (RtreeCell *)auStack_458);
        if (0 < errCode) {
          sqlite3_str_append((sqlite3_str *)cell.aCoord._32_8_," ",1);
        }
        sqlite3_str_appendf((StrAccum *)cell.aCoord._32_8_,"{%lld",_auStack_458);
        for (local_45c = 0; local_45c < (int)(uint)tree.db._5_1_; local_45c = local_45c + 1) {
          sqlite3_str_appendf((StrAccum *)cell.aCoord._32_8_," %g",
                              (double)cell.aCoord[(long)local_45c + -2].f);
        }
        sqlite3_str_append((sqlite3_str *)cell.aCoord._32_8_,"}",1);
      }
      iVar1 = sqlite3_str_errcode((sqlite3_str *)cell.aCoord._32_8_);
      z = sqlite3_str_finish((sqlite3_str *)cell.aCoord._32_8_);
      sqlite3_result_text(ctx,z,-1,sqlite3_free);
      sqlite3_result_error_code(ctx,iVar1);
    }
  }
  return;
}

Assistant:

static void rtreenode(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  RtreeNode node;
  Rtree tree;
  int ii;
  int nData;
  int errCode;
  sqlite3_str *pOut;

  UNUSED_PARAMETER(nArg);
  memset(&node, 0, sizeof(RtreeNode));
  memset(&tree, 0, sizeof(Rtree));
  tree.nDim = (u8)sqlite3_value_int(apArg[0]);
  if( tree.nDim<1 || tree.nDim>5 ) return;
  tree.nDim2 = tree.nDim*2;
  tree.nBytesPerCell = 8 + 8 * tree.nDim;
  node.zData = (u8 *)sqlite3_value_blob(apArg[1]);
  nData = sqlite3_value_bytes(apArg[1]);
  if( nData<4 ) return;
  if( nData<NCELL(&node)*tree.nBytesPerCell ) return;

  pOut = sqlite3_str_new(0);
  for(ii=0; ii<NCELL(&node); ii++){
    RtreeCell cell;
    int jj;

    nodeGetCell(&tree, &node, ii, &cell);
    if( ii>0 ) sqlite3_str_append(pOut, " ", 1);
    sqlite3_str_appendf(pOut, "{%lld", cell.iRowid);
    for(jj=0; jj<tree.nDim2; jj++){
#ifndef SQLITE_RTREE_INT_ONLY
      sqlite3_str_appendf(pOut, " %g", (double)cell.aCoord[jj].f);
#else
      sqlite3_str_appendf(pOut, " %d", cell.aCoord[jj].i);
#endif
    }
    sqlite3_str_append(pOut, "}", 1);
  }
  errCode = sqlite3_str_errcode(pOut);
  sqlite3_result_text(ctx, sqlite3_str_finish(pOut), -1, sqlite3_free);
  sqlite3_result_error_code(ctx, errCode);
}